

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

void embree::avx::ConeCurveMiIntersectorK<8,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  float fVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  ulong uVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  uint uVar90;
  uint uVar91;
  ulong uVar92;
  Scene *pSVar93;
  long lVar94;
  float fVar95;
  undefined1 auVar96 [16];
  float fVar106;
  float fVar107;
  float fVar109;
  float fVar110;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar111;
  undefined1 auVar101 [32];
  float fVar112;
  undefined1 auVar102 [32];
  float fVar108;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar116 [16];
  float fVar125;
  float fVar128;
  float fVar134;
  float fVar135;
  float fVar137;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar126;
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar136;
  float fVar138;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar139;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar157;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar176;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  float fVar189;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar204 [16];
  undefined1 auVar205 [28];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  float fVar209;
  float fVar211;
  float fVar212;
  undefined1 auVar210 [64];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  float fVar215;
  undefined1 auVar216 [32];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar217 [64];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  float fVar228;
  float fVar229;
  undefined1 auVar230 [32];
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar231 [64];
  undefined1 auVar244 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RoundLineIntersectorHitM<8> hit;
  undefined8 local_670;
  undefined8 uStack_668;
  Scene *local_660;
  undefined4 local_654;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined4 uStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined4 local_380;
  undefined4 uStack_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  pSVar93 = context->scene;
  uVar91 = line->sharedGeomID;
  uVar90 = (line->v0).field_0.i[0];
  pGVar10 = (pSVar93->geometries).items[uVar91].ptr;
  lVar94 = *(long *)&pGVar10[1].time_range.upper;
  p_Var11 = pGVar10[1].intersectionFilterN;
  uVar3 = (line->v0).field_0.i[1];
  uVar4 = (line->v0).field_0.i[4];
  uVar5 = (line->v0).field_0.i[5];
  auVar97._16_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)uVar4 * (long)p_Var11);
  auVar97._0_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)uVar90 * (long)p_Var11);
  auVar117._16_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)uVar5 * (long)p_Var11);
  auVar117._0_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)uVar3 * (long)p_Var11);
  uVar6 = (line->v0).field_0.i[2];
  uVar7 = (line->v0).field_0.i[3];
  uVar8 = (line->v0).field_0.i[6];
  auVar140._16_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)uVar8 * (long)p_Var11);
  auVar140._0_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)uVar6 * (long)p_Var11);
  uVar9 = (line->v0).field_0.i[7];
  auVar154._16_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)uVar9 * (long)p_Var11);
  auVar154._0_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)uVar7 * (long)p_Var11);
  auVar190._16_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)(uVar4 + 1) * (long)p_Var11);
  auVar190._0_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)(uVar90 + 1) * (long)p_Var11);
  auVar206._16_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)(uVar5 + 1) * (long)p_Var11);
  auVar206._0_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)(uVar3 + 1) * (long)p_Var11);
  auVar195 = vunpcklps_avx(auVar97,auVar140);
  auVar160 = vunpckhps_avx(auVar97,auVar140);
  auVar216 = vunpcklps_avx(auVar117,auVar154);
  auVar180 = vunpckhps_avx(auVar117,auVar154);
  auVar47 = vunpcklps_avx(auVar195,auVar216);
  auVar226 = vunpckhps_avx(auVar195,auVar216);
  auVar48 = vunpcklps_avx(auVar160,auVar180);
  auVar230 = vunpckhps_avx(auVar160,auVar180);
  auVar98._16_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)(uVar8 + 1) * (long)p_Var11);
  auVar98._0_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)(uVar6 + 1) * (long)p_Var11);
  auVar118._16_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)(uVar9 + 1) * (long)p_Var11);
  auVar118._0_16_ = *(undefined1 (*) [16])(lVar94 + (ulong)(uVar7 + 1) * (long)p_Var11);
  auVar195 = vunpcklps_avx(auVar190,auVar98);
  auVar160 = vunpckhps_avx(auVar190,auVar98);
  auVar216 = vunpcklps_avx(auVar206,auVar118);
  auVar180 = vunpckhps_avx(auVar206,auVar118);
  auVar117 = vunpcklps_avx(auVar195,auVar216);
  auVar97 = vunpckhps_avx(auVar195,auVar216);
  auVar118 = vunpcklps_avx(auVar160,auVar180);
  auVar98 = vunpckhps_avx(auVar160,auVar180);
  auVar96 = vpcmpeqd_avx(auVar98._0_16_,auVar98._0_16_);
  auVar116 = vpcmpeqd_avx(auVar96,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar96 = vpcmpeqd_avx(auVar96,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_170 = vshufps_avx(ZEXT416(uVar91),ZEXT416(uVar91),0);
  local_180 = local_170;
  local_300 = *(float *)(ray + k * 4 + 0x40);
  local_580 = *(float *)(ray + k * 4 + 0x50);
  local_260 = *(float *)(ray + k * 4 + 0x60);
  auVar99._16_16_ = auVar96;
  auVar99._0_16_ = auVar116;
  auVar96 = ZEXT416((uint)(local_300 * local_300 + local_580 * local_580 + local_260 * local_260));
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar100._16_16_ = auVar96;
  auVar100._0_16_ = auVar96;
  auVar160 = vrcpps_avx(auVar100);
  fVar113 = auVar160._0_4_;
  fVar125 = auVar160._4_4_;
  auVar180._4_4_ = fVar125 * auVar96._4_4_;
  auVar180._0_4_ = fVar113 * auVar96._0_4_;
  fVar128 = auVar160._8_4_;
  auVar180._8_4_ = fVar128 * auVar96._8_4_;
  fVar131 = auVar160._12_4_;
  auVar180._12_4_ = fVar131 * auVar96._12_4_;
  fVar112 = auVar160._16_4_;
  auVar180._16_4_ = fVar112 * auVar96._0_4_;
  fVar135 = auVar160._20_4_;
  auVar180._20_4_ = fVar135 * auVar96._4_4_;
  fVar137 = auVar160._24_4_;
  auVar180._24_4_ = fVar137 * auVar96._8_4_;
  auVar180._28_4_ = auVar96._12_4_;
  auVar141._8_4_ = 0x3f800000;
  auVar141._0_8_ = &DAT_3f8000003f800000;
  auVar141._12_4_ = 0x3f800000;
  auVar141._16_4_ = 0x3f800000;
  auVar141._20_4_ = 0x3f800000;
  auVar141._24_4_ = 0x3f800000;
  auVar141._28_4_ = 0x3f800000;
  auVar180 = vsubps_avx(auVar141,auVar180);
  fVar111 = auVar160._28_4_ + auVar180._28_4_;
  auVar216._4_4_ = (auVar47._4_4_ + auVar117._4_4_) * 0.5;
  auVar216._0_4_ = (auVar47._0_4_ + auVar117._0_4_) * 0.5;
  auVar216._8_4_ = (auVar47._8_4_ + auVar117._8_4_) * 0.5;
  auVar216._12_4_ = (auVar47._12_4_ + auVar117._12_4_) * 0.5;
  auVar216._16_4_ = (auVar47._16_4_ + auVar117._16_4_) * 0.5;
  auVar216._20_4_ = (auVar47._20_4_ + auVar117._20_4_) * 0.5;
  auVar216._24_4_ = (auVar47._24_4_ + auVar117._24_4_) * 0.5;
  auVar216._28_4_ = auVar47._28_4_ + auVar117._28_4_;
  fVar139 = auVar226._28_4_;
  auVar160._4_4_ = (auVar97._4_4_ + auVar226._4_4_) * 0.5;
  auVar160._0_4_ = (auVar97._0_4_ + auVar226._0_4_) * 0.5;
  auVar160._8_4_ = (auVar97._8_4_ + auVar226._8_4_) * 0.5;
  auVar160._12_4_ = (auVar97._12_4_ + auVar226._12_4_) * 0.5;
  auVar160._16_4_ = (auVar97._16_4_ + auVar226._16_4_) * 0.5;
  auVar160._20_4_ = (auVar97._20_4_ + auVar226._20_4_) * 0.5;
  auVar160._24_4_ = (auVar97._24_4_ + auVar226._24_4_) * 0.5;
  auVar160._28_4_ = auVar97._28_4_ + fVar139;
  auVar195._4_4_ = (auVar48._4_4_ + auVar118._4_4_) * 0.5;
  auVar195._0_4_ = (auVar48._0_4_ + auVar118._0_4_) * 0.5;
  auVar195._8_4_ = (auVar48._8_4_ + auVar118._8_4_) * 0.5;
  auVar195._12_4_ = (auVar48._12_4_ + auVar118._12_4_) * 0.5;
  auVar195._16_4_ = (auVar48._16_4_ + auVar118._16_4_) * 0.5;
  auVar195._20_4_ = (auVar48._20_4_ + auVar118._20_4_) * 0.5;
  auVar195._24_4_ = (auVar48._24_4_ + auVar118._24_4_) * 0.5;
  auVar195._28_4_ = 0x3f000000;
  fVar209 = *(float *)(ray + k * 4 + 0x10);
  auVar177._4_4_ = fVar209;
  auVar177._0_4_ = fVar209;
  auVar177._8_4_ = fVar209;
  auVar177._12_4_ = fVar209;
  auVar177._16_4_ = fVar209;
  auVar177._20_4_ = fVar209;
  auVar177._24_4_ = fVar209;
  auVar177._28_4_ = fVar209;
  auVar160 = vsubps_avx(auVar160,auVar177);
  fVar211 = *(float *)(ray + k * 4 + 0x20);
  auVar191._4_4_ = fVar211;
  auVar191._0_4_ = fVar211;
  auVar191._8_4_ = fVar211;
  auVar191._12_4_ = fVar211;
  auVar191._16_4_ = fVar211;
  auVar191._20_4_ = fVar211;
  auVar191._24_4_ = fVar211;
  auVar191._28_4_ = fVar211;
  auVar195 = vsubps_avx(auVar195,auVar191);
  fVar212 = *(float *)(ray + k * 4);
  auVar169._4_4_ = fVar212;
  auVar169._0_4_ = fVar212;
  auVar169._8_4_ = fVar212;
  auVar169._12_4_ = fVar212;
  auVar169._16_4_ = fVar212;
  auVar169._20_4_ = fVar212;
  auVar169._24_4_ = fVar212;
  auVar169._28_4_ = fVar212;
  auVar216 = vsubps_avx(auVar216,auVar169);
  fStack_4c4 = auVar216._28_4_ + auVar160._28_4_ + auVar195._28_4_;
  fVar114 = (local_300 * auVar216._0_4_ + local_580 * auVar160._0_4_ + auVar195._0_4_ * local_260) *
            (fVar113 + fVar113 * auVar180._0_4_);
  fVar126 = (local_300 * auVar216._4_4_ + local_580 * auVar160._4_4_ + auVar195._4_4_ * local_260) *
            (fVar125 + fVar125 * auVar180._4_4_);
  fVar129 = (local_300 * auVar216._8_4_ + local_580 * auVar160._8_4_ + auVar195._8_4_ * local_260) *
            (fVar128 + fVar128 * auVar180._8_4_);
  fVar132 = (local_300 * auVar216._12_4_ + local_580 * auVar160._12_4_ + auVar195._12_4_ * local_260
            ) * (fVar131 + fVar131 * auVar180._12_4_);
  fStack_4d0 = (local_300 * auVar216._16_4_ +
               local_580 * auVar160._16_4_ + auVar195._16_4_ * local_260) *
               (fVar112 + fVar112 * auVar180._16_4_);
  fStack_4cc = (local_300 * auVar216._20_4_ +
               local_580 * auVar160._20_4_ + auVar195._20_4_ * local_260) *
               (fVar135 + fVar135 * auVar180._20_4_);
  fStack_4c8 = (local_300 * auVar216._24_4_ +
               local_580 * auVar160._24_4_ + auVar195._24_4_ * local_260) *
               (fVar137 + fVar137 * auVar180._24_4_);
  auVar142._0_4_ = fVar212 + local_300 * fVar114;
  auVar142._4_4_ = fVar212 + local_300 * fVar126;
  auVar142._8_4_ = fVar212 + local_300 * fVar129;
  auVar142._12_4_ = fVar212 + local_300 * fVar132;
  auVar142._16_4_ = fVar212 + local_300 * fStack_4d0;
  auVar142._20_4_ = fVar212 + local_300 * fStack_4cc;
  auVar142._24_4_ = fVar212 + local_300 * fStack_4c8;
  auVar142._28_4_ = fVar212 + fVar111;
  auVar225._0_4_ = fVar209 + local_580 * fVar114;
  auVar225._4_4_ = fVar209 + local_580 * fVar126;
  auVar225._8_4_ = fVar209 + local_580 * fVar129;
  auVar225._12_4_ = fVar209 + local_580 * fVar132;
  auVar225._16_4_ = fVar209 + local_580 * fStack_4d0;
  auVar225._20_4_ = fVar209 + local_580 * fStack_4cc;
  auVar225._24_4_ = fVar209 + local_580 * fStack_4c8;
  auVar225._28_4_ = fVar209 + fVar111;
  auVar101._0_4_ = fVar211 + local_260 * fVar114;
  auVar101._4_4_ = fVar211 + local_260 * fVar126;
  auVar101._8_4_ = fVar211 + local_260 * fVar129;
  auVar101._12_4_ = fVar211 + local_260 * fVar132;
  auVar101._16_4_ = fVar211 + local_260 * fStack_4d0;
  auVar101._20_4_ = fVar211 + local_260 * fStack_4cc;
  auVar101._24_4_ = fVar211 + local_260 * fStack_4c8;
  auVar101._28_4_ = fVar211 + fVar111;
  local_280 = vsubps_avx(auVar97,auVar226);
  local_2a0 = vsubps_avx(auVar118,auVar48);
  fVar209 = local_2a0._0_4_;
  fVar135 = local_2a0._4_4_;
  fVar16 = local_2a0._8_4_;
  fVar22 = local_2a0._12_4_;
  fVar28 = local_2a0._16_4_;
  fVar34 = local_2a0._20_4_;
  fVar40 = local_2a0._24_4_;
  fVar211 = local_280._0_4_;
  fVar137 = local_280._4_4_;
  fVar17 = local_280._8_4_;
  fVar23 = local_280._12_4_;
  fVar29 = local_280._16_4_;
  fVar35 = local_280._20_4_;
  fVar41 = local_280._24_4_;
  fVar168 = fVar212 + fStack_4c4;
  local_600 = vsubps_avx(auVar117,auVar47);
  fVar111 = local_600._0_4_;
  fVar12 = local_600._4_4_;
  fVar18 = local_600._8_4_;
  fVar24 = local_600._12_4_;
  fVar30 = local_600._16_4_;
  fVar36 = local_600._20_4_;
  fVar42 = local_600._24_4_;
  fVar228 = fVar111 * fVar111 + fVar211 * fVar211 + fVar209 * fVar209;
  fVar232 = fVar12 * fVar12 + fVar137 * fVar137 + fVar135 * fVar135;
  fVar234 = fVar18 * fVar18 + fVar17 * fVar17 + fVar16 * fVar16;
  fVar236 = fVar24 * fVar24 + fVar23 * fVar23 + fVar22 * fVar22;
  fVar238 = fVar30 * fVar30 + fVar29 * fVar29 + fVar28 * fVar28;
  fVar240 = fVar36 * fVar36 + fVar35 * fVar35 + fVar34 * fVar34;
  fVar242 = fVar42 * fVar42 + fVar41 * fVar41 + fVar40 * fVar40;
  local_4a0 = vsubps_avx(auVar225,auVar226);
  local_2c0 = vsubps_avx(auVar101,auVar48);
  fVar113 = local_2c0._0_4_;
  fVar13 = local_2c0._4_4_;
  fVar19 = local_2c0._8_4_;
  fVar25 = local_2c0._12_4_;
  fVar31 = local_2c0._16_4_;
  fVar37 = local_2c0._20_4_;
  fVar43 = local_2c0._24_4_;
  fVar125 = local_4a0._0_4_;
  fVar14 = local_4a0._4_4_;
  fVar20 = local_4a0._8_4_;
  fVar26 = local_4a0._12_4_;
  fVar32 = local_4a0._16_4_;
  fVar38 = local_4a0._20_4_;
  fVar44 = local_4a0._24_4_;
  _local_1a0 = vsubps_avx(auVar142,auVar47);
  fVar128 = local_1a0._0_4_;
  fVar15 = local_1a0._4_4_;
  fVar21 = local_1a0._8_4_;
  fVar27 = local_1a0._12_4_;
  fVar33 = local_1a0._16_4_;
  fVar39 = local_1a0._20_4_;
  fVar45 = local_1a0._24_4_;
  fVar215 = fVar111 * fVar128 + fVar211 * fVar125 + fVar209 * fVar113;
  fVar218 = fVar12 * fVar15 + fVar137 * fVar14 + fVar135 * fVar13;
  fVar219 = fVar18 * fVar21 + fVar17 * fVar20 + fVar16 * fVar19;
  fVar220 = fVar24 * fVar27 + fVar23 * fVar26 + fVar22 * fVar25;
  fVar221 = fVar30 * fVar33 + fVar29 * fVar32 + fVar28 * fVar31;
  fVar222 = fVar36 * fVar39 + fVar35 * fVar38 + fVar34 * fVar37;
  fVar223 = fVar42 * fVar45 + fVar41 * fVar44 + fVar40 * fVar43;
  fVar224 = fVar168 + fVar139 + auVar101._28_4_;
  fVar112 = fVar168 + fVar139 + auVar101._28_4_;
  auVar213._0_4_ = local_300 * fVar111 + local_580 * fVar211 + fVar209 * local_260;
  auVar213._4_4_ = local_300 * fVar12 + local_580 * fVar137 + fVar135 * local_260;
  auVar213._8_4_ = local_300 * fVar18 + local_580 * fVar17 + fVar16 * local_260;
  auVar213._12_4_ = local_300 * fVar24 + local_580 * fVar23 + fVar22 * local_260;
  auVar213._16_4_ = local_300 * fVar30 + local_580 * fVar29 + fVar28 * local_260;
  auVar213._20_4_ = local_300 * fVar36 + local_580 * fVar35 + fVar34 * local_260;
  auVar213._24_4_ = local_300 * fVar42 + local_580 * fVar41 + fVar40 * local_260;
  auVar213._28_4_ = fVar168 + fVar112;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  auVar100 = _local_1a0;
  auVar160 = vsubps_avx(auVar230,auVar98);
  fVar131 = auVar160._0_4_;
  fVar95 = auVar160._4_4_;
  fVar106 = auVar160._8_4_;
  fVar107 = auVar160._12_4_;
  fVar108 = auVar160._16_4_;
  fVar109 = auVar160._20_4_;
  fVar110 = auVar160._24_4_;
  fVar115 = fVar228 + fVar131 * fVar131;
  fVar127 = fVar232 + fVar95 * fVar95;
  fVar130 = fVar234 + fVar106 * fVar106;
  fVar133 = fVar236 + fVar107 * fVar107;
  fVar134 = fVar238 + fVar108 * fVar108;
  fVar136 = fVar240 + fVar109 * fVar109;
  fVar138 = fVar242 + fVar110 * fVar110;
  fVar157 = fVar228 * fVar228;
  fVar162 = fVar232 * fVar232;
  local_120._4_4_ = fVar162;
  local_120._0_4_ = fVar157;
  fVar163 = fVar234 * fVar234;
  fStack_118 = fVar163;
  fVar164 = fVar236 * fVar236;
  fStack_114 = fVar164;
  fVar165 = fVar238 * fVar238;
  fStack_110 = fVar165;
  fVar166 = fVar240 * fVar240;
  fStack_10c = fVar166;
  fVar167 = fVar242 * fVar242;
  fStack_108 = fVar167;
  uStack_104 = fVar139 + fVar168;
  auVar226._4_4_ = fVar162 * (local_300 * fVar15 + local_580 * fVar14 + local_260 * fVar13);
  auVar226._0_4_ = fVar157 * (local_300 * fVar128 + local_580 * fVar125 + local_260 * fVar113);
  auVar226._8_4_ = fVar163 * (local_300 * fVar21 + local_580 * fVar20 + local_260 * fVar19);
  auVar226._12_4_ = fVar164 * (local_300 * fVar27 + local_580 * fVar26 + local_260 * fVar25);
  auVar226._16_4_ = fVar165 * (local_300 * fVar33 + local_580 * fVar32 + local_260 * fVar31);
  auVar226._20_4_ = fVar166 * (local_300 * fVar39 + local_580 * fVar38 + local_260 * fVar37);
  auVar226._24_4_ = fVar167 * (local_300 * fVar45 + local_580 * fVar44 + local_260 * fVar43);
  auVar226._28_4_ = fVar168 + fVar168 + fVar112;
  fVar49 = local_2a0._28_4_;
  auVar47._4_4_ = auVar213._4_4_ * fVar218 * fVar127;
  auVar47._0_4_ = auVar213._0_4_ * fVar215 * fVar115;
  auVar47._8_4_ = auVar213._8_4_ * fVar219 * fVar130;
  auVar47._12_4_ = auVar213._12_4_ * fVar220 * fVar133;
  auVar47._16_4_ = auVar213._16_4_ * fVar221 * fVar134;
  auVar47._20_4_ = auVar213._20_4_ * fVar222 * fVar136;
  auVar47._24_4_ = auVar213._24_4_ * fVar223 * fVar138;
  auVar47._28_4_ = fVar49;
  auVar180 = vsubps_avx(auVar226,auVar47);
  fVar112 = auVar230._0_4_;
  fVar189 = fVar228 * fVar112;
  fVar183 = auVar230._4_4_;
  fVar198 = fVar232 * fVar183;
  auVar48._4_4_ = fVar198;
  auVar48._0_4_ = fVar189;
  fVar184 = auVar230._8_4_;
  fVar199 = fVar234 * fVar184;
  auVar48._8_4_ = fVar199;
  fVar185 = auVar230._12_4_;
  fVar200 = fVar236 * fVar185;
  auVar48._12_4_ = fVar200;
  fVar186 = auVar230._16_4_;
  fVar201 = fVar238 * fVar186;
  auVar48._16_4_ = fVar201;
  fVar187 = auVar230._20_4_;
  fVar202 = fVar240 * fVar187;
  auVar48._20_4_ = fVar202;
  fVar188 = auVar230._24_4_;
  fVar203 = fVar242 * fVar188;
  auVar48._24_4_ = fVar203;
  auVar48._28_4_ = fVar49;
  auVar102._0_4_ = fVar189 * auVar213._0_4_ * fVar131 + auVar180._0_4_;
  auVar102._4_4_ = fVar198 * auVar213._4_4_ * fVar95 + auVar180._4_4_;
  auVar102._8_4_ = fVar199 * auVar213._8_4_ * fVar106 + auVar180._8_4_;
  auVar102._12_4_ = fVar200 * auVar213._12_4_ * fVar107 + auVar180._12_4_;
  auVar102._16_4_ = fVar201 * auVar213._16_4_ * fVar108 + auVar180._16_4_;
  auVar102._20_4_ = fVar202 * auVar213._20_4_ * fVar109 + auVar180._20_4_;
  auVar102._24_4_ = fVar203 * auVar213._24_4_ * fVar110 + auVar180._24_4_;
  auVar102._28_4_ = local_580 + auVar180._28_4_;
  auVar230._4_4_ = fVar162 * (fVar15 * fVar15 + fVar14 * fVar14 + fVar13 * fVar13);
  auVar230._0_4_ = fVar157 * (fVar128 * fVar128 + fVar125 * fVar125 + fVar113 * fVar113);
  auVar230._8_4_ = fVar163 * (fVar21 * fVar21 + fVar20 * fVar20 + fVar19 * fVar19);
  auVar230._12_4_ = fVar164 * (fVar27 * fVar27 + fVar26 * fVar26 + fVar25 * fVar25);
  auVar230._16_4_ = fVar165 * (fVar33 * fVar33 + fVar32 * fVar32 + fVar31 * fVar31);
  auVar230._20_4_ = fVar166 * (fVar39 * fVar39 + fVar38 * fVar38 + fVar37 * fVar37);
  auVar230._24_4_ = fVar167 * (fVar45 * fVar45 + fVar44 * fVar44 + fVar43 * fVar43);
  auVar230._28_4_ = fVar139 + fVar139 + fVar168;
  auVar50._4_4_ = fVar218 * fVar218 * fVar127;
  auVar50._0_4_ = fVar215 * fVar215 * fVar115;
  auVar50._8_4_ = fVar219 * fVar219 * fVar130;
  auVar50._12_4_ = fVar220 * fVar220 * fVar133;
  auVar50._16_4_ = fVar221 * fVar221 * fVar134;
  auVar50._20_4_ = fVar222 * fVar222 * fVar136;
  auVar50._24_4_ = fVar223 * fVar223 * fVar138;
  auVar50._28_4_ = local_580;
  auVar180 = vsubps_avx(auVar230,auVar50);
  fStack_204 = auVar160._28_4_;
  auVar51._4_4_ = (fVar95 + fVar95) * fVar218;
  auVar51._0_4_ = (fVar131 + fVar131) * fVar215;
  auVar51._8_4_ = (fVar106 + fVar106) * fVar219;
  auVar51._12_4_ = (fVar107 + fVar107) * fVar220;
  auVar51._16_4_ = (fVar108 + fVar108) * fVar221;
  auVar51._20_4_ = (fVar109 + fVar109) * fVar222;
  auVar51._24_4_ = (fVar110 + fVar110) * fVar223;
  auVar51._28_4_ = fStack_204 + fStack_204;
  auVar160 = vsubps_avx(auVar51,auVar48);
  fVar139 = auVar213._0_4_ * auVar213._0_4_;
  fVar148 = auVar213._4_4_ * auVar213._4_4_;
  fVar149 = auVar213._8_4_ * auVar213._8_4_;
  fVar150 = auVar213._12_4_ * auVar213._12_4_;
  fVar151 = auVar213._16_4_ * auVar213._16_4_;
  fVar152 = auVar213._20_4_ * auVar213._20_4_;
  fVar153 = auVar213._24_4_ * auVar213._24_4_;
  auVar52._4_4_ = fVar127 * fVar148;
  auVar52._0_4_ = fVar115 * fVar139;
  auVar52._8_4_ = fVar130 * fVar149;
  auVar52._12_4_ = fVar133 * fVar150;
  auVar52._16_4_ = fVar134 * fVar151;
  auVar52._20_4_ = fVar136 * fVar152;
  auVar52._24_4_ = fVar138 * fVar153;
  auVar52._28_4_ = fVar49;
  auVar195 = vsubps_avx(_local_120,auVar52);
  auVar53._4_4_ = auVar195._4_4_ * (fVar198 * auVar160._4_4_ + auVar180._4_4_);
  auVar53._0_4_ = auVar195._0_4_ * (fVar189 * auVar160._0_4_ + auVar180._0_4_);
  auVar53._8_4_ = auVar195._8_4_ * (fVar199 * auVar160._8_4_ + auVar180._8_4_);
  auVar53._12_4_ = auVar195._12_4_ * (fVar200 * auVar160._12_4_ + auVar180._12_4_);
  auVar53._16_4_ = auVar195._16_4_ * (fVar201 * auVar160._16_4_ + auVar180._16_4_);
  auVar53._20_4_ = auVar195._20_4_ * (fVar202 * auVar160._20_4_ + auVar180._20_4_);
  auVar53._24_4_ = auVar195._24_4_ * (fVar203 * auVar160._24_4_ + auVar180._24_4_);
  auVar53._28_4_ = fVar49 + auVar180._28_4_;
  auVar54._4_4_ = auVar102._4_4_ * auVar102._4_4_;
  auVar54._0_4_ = auVar102._0_4_ * auVar102._0_4_;
  auVar54._8_4_ = auVar102._8_4_ * auVar102._8_4_;
  auVar54._12_4_ = auVar102._12_4_ * auVar102._12_4_;
  auVar54._16_4_ = auVar102._16_4_ * auVar102._16_4_;
  auVar54._20_4_ = auVar102._20_4_ * auVar102._20_4_;
  auVar54._24_4_ = auVar102._24_4_ * auVar102._24_4_;
  auVar54._28_4_ = auVar160._28_4_;
  auVar180 = vsubps_avx(auVar54,auVar53);
  uVar92 = (ulong)((line->leftExists & 0xf) << 4);
  auVar160 = vcmpps_avx(auVar180,ZEXT832(0) << 0x20,5);
  auVar216 = auVar160 & ~auVar99;
  if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar216 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar216 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar216 >> 0x7f,0) != '\0') ||
        (auVar216 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar216 >> 0xbf,0) != '\0') ||
      (auVar216 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar216[0x1f] < '\0')
  {
    auVar216 = vandnps_avx(auVar99,auVar160);
    auVar230 = vsubps_avx(auVar142,auVar117);
    auVar97 = vsubps_avx(auVar225,auVar97);
    auVar47 = vsubps_avx(auVar101,auVar118);
    fVar229 = auVar230._0_4_ * fVar111 + auVar97._0_4_ * fVar211 + auVar47._0_4_ * fVar209;
    fVar233 = auVar230._4_4_ * fVar12 + auVar97._4_4_ * fVar137 + auVar47._4_4_ * fVar135;
    fVar235 = auVar230._8_4_ * fVar18 + auVar97._8_4_ * fVar17 + auVar47._8_4_ * fVar16;
    fVar237 = auVar230._12_4_ * fVar24 + auVar97._12_4_ * fVar23 + auVar47._12_4_ * fVar22;
    fVar239 = auVar230._16_4_ * fVar30 + auVar97._16_4_ * fVar29 + auVar47._16_4_ * fVar28;
    fVar241 = auVar230._20_4_ * fVar36 + auVar97._20_4_ * fVar35 + auVar47._20_4_ * fVar34;
    fVar243 = auVar230._24_4_ * fVar42 + auVar97._24_4_ * fVar41 + auVar47._24_4_ * fVar40;
    auVar180 = vsqrtps_avx(auVar180);
    auVar226 = vrcpps_avx(auVar195);
    fVar189 = auVar226._0_4_;
    auVar173._0_4_ = auVar195._0_4_ * fVar189;
    fVar198 = auVar226._4_4_;
    auVar173._4_4_ = auVar195._4_4_ * fVar198;
    fVar199 = auVar226._8_4_;
    auVar173._8_4_ = auVar195._8_4_ * fVar199;
    fVar200 = auVar226._12_4_;
    auVar173._12_4_ = auVar195._12_4_ * fVar200;
    fVar201 = auVar226._16_4_;
    auVar173._16_4_ = auVar195._16_4_ * fVar201;
    fVar202 = auVar226._20_4_;
    auVar173._20_4_ = auVar195._20_4_ * fVar202;
    fVar203 = auVar226._24_4_;
    auVar173._24_4_ = auVar195._24_4_ * fVar203;
    auVar173._28_4_ = 0;
    fStack_214 = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + uVar92 + 8) >> 0x20);
    auVar170._8_4_ = 0x3f800000;
    auVar170._0_8_ = &DAT_3f8000003f800000;
    auVar170._12_4_ = 0x3f800000;
    auVar170._16_4_ = 0x3f800000;
    auVar170._20_4_ = 0x3f800000;
    auVar170._24_4_ = 0x3f800000;
    auVar170._28_4_ = 0x3f800000;
    auVar48 = vsubps_avx(auVar170,auVar173);
    auVar178._8_4_ = 0x7fffffff;
    auVar178._0_8_ = 0x7fffffff7fffffff;
    auVar178._12_4_ = 0x7fffffff;
    auVar178._16_4_ = 0x7fffffff;
    auVar178._20_4_ = 0x7fffffff;
    auVar178._24_4_ = 0x7fffffff;
    auVar178._28_4_ = 0x7fffffff;
    fVar189 = fVar189 + fVar189 * auVar48._0_4_;
    fVar198 = fVar198 + fVar198 * auVar48._4_4_;
    fVar199 = fVar199 + fVar199 * auVar48._8_4_;
    fVar200 = fVar200 + fVar200 * auVar48._12_4_;
    fVar201 = fVar201 + fVar201 * auVar48._16_4_;
    fVar202 = fVar202 + fVar202 * auVar48._20_4_;
    fVar203 = fVar203 + fVar203 * auVar48._24_4_;
    auVar160 = vandps_avx(auVar195,auVar178);
    auVar192._8_4_ = 0x219392ef;
    auVar192._0_8_ = 0x219392ef219392ef;
    auVar192._12_4_ = 0x219392ef;
    auVar192._16_4_ = 0x219392ef;
    auVar192._20_4_ = 0x219392ef;
    auVar192._24_4_ = 0x219392ef;
    auVar192._28_4_ = 0x219392ef;
    auVar160 = vcmpps_avx(auVar160,auVar192,2);
    uVar83 = CONCAT44(auVar102._4_4_,auVar102._0_4_);
    auVar193._0_8_ = uVar83 ^ 0x8000000080000000;
    auVar193._8_4_ = -auVar102._8_4_;
    auVar193._12_4_ = -auVar102._12_4_;
    auVar193._16_4_ = -auVar102._16_4_;
    auVar193._20_4_ = -auVar102._20_4_;
    auVar193._24_4_ = -auVar102._24_4_;
    auVar193._28_4_ = -auVar102._28_4_;
    auVar195 = vsubps_avx(auVar193,auVar180);
    auVar117 = vsubps_avx(auVar180,auVar102);
    auVar55._4_4_ = auVar195._4_4_ * fVar198;
    auVar55._0_4_ = auVar195._0_4_ * fVar189;
    auVar55._8_4_ = auVar195._8_4_ * fVar199;
    auVar55._12_4_ = auVar195._12_4_ * fVar200;
    auVar55._16_4_ = auVar195._16_4_ * fVar201;
    auVar55._20_4_ = auVar195._20_4_ * fVar202;
    auVar55._24_4_ = auVar195._24_4_ * fVar203;
    auVar55._28_4_ = auVar180._28_4_;
    auVar56._4_4_ = auVar117._4_4_ * fVar198;
    auVar56._0_4_ = auVar117._0_4_ * fVar189;
    auVar56._8_4_ = auVar117._8_4_ * fVar199;
    auVar56._12_4_ = auVar117._12_4_ * fVar200;
    auVar56._16_4_ = auVar117._16_4_ * fVar201;
    auVar56._20_4_ = auVar117._20_4_ * fVar202;
    auVar56._24_4_ = auVar117._24_4_ * fVar203;
    auVar56._28_4_ = auVar117._28_4_;
    auVar119._8_4_ = 0xff800000;
    auVar119._0_8_ = 0xff800000ff800000;
    auVar119._12_4_ = 0xff800000;
    auVar119._16_4_ = 0xff800000;
    auVar119._20_4_ = 0xff800000;
    auVar119._24_4_ = 0xff800000;
    auVar119._28_4_ = 0xff800000;
    auVar180 = vblendvps_avx(auVar55,auVar119,auVar160);
    auVar158._8_4_ = 0x7f800000;
    auVar158._0_8_ = 0x7f8000007f800000;
    auVar158._12_4_ = 0x7f800000;
    auVar158._16_4_ = 0x7f800000;
    auVar158._20_4_ = 0x7f800000;
    auVar158._24_4_ = 0x7f800000;
    auVar158._28_4_ = 0x7f800000;
    auVar195 = vblendvps_avx(auVar56,auVar158,auVar160);
    auVar179._0_4_ = fVar215 + auVar213._0_4_ * auVar180._0_4_;
    auVar179._4_4_ = fVar218 + auVar213._4_4_ * auVar180._4_4_;
    auVar179._8_4_ = fVar219 + auVar213._8_4_ * auVar180._8_4_;
    auVar179._12_4_ = fVar220 + auVar213._12_4_ * auVar180._12_4_;
    auVar179._16_4_ = fVar221 + auVar213._16_4_ * auVar180._16_4_;
    auVar179._20_4_ = fVar222 + auVar213._20_4_ * auVar180._20_4_;
    auVar179._24_4_ = fVar223 + auVar213._24_4_ * auVar180._24_4_;
    auVar179._28_4_ = fVar224 + auVar226._28_4_ + auVar48._28_4_;
    auVar160 = vcmpps_avx(auVar179,ZEXT432(0) << 0x20,6);
    auVar88._4_4_ = fVar232;
    auVar88._0_4_ = fVar228;
    auVar88._8_4_ = fVar234;
    auVar88._12_4_ = fVar236;
    auVar88._16_4_ = fVar238;
    auVar88._20_4_ = fVar240;
    auVar88._24_4_ = fVar242;
    auVar88._28_4_ = fVar212 + fVar168;
    auVar226 = vcmpps_avx(auVar179,auVar88,1);
    auVar160 = vandps_avx(auVar226,auVar160);
    auVar160 = vandps_avx(auVar216,auVar160);
    local_320 = vblendvps_avx(auVar158,auVar180,auVar160);
    local_540._0_4_ = fVar215 + auVar213._0_4_ * auVar195._0_4_;
    local_540._4_4_ = fVar218 + auVar213._4_4_ * auVar195._4_4_;
    fStack_538 = fVar219 + auVar213._8_4_ * auVar195._8_4_;
    fStack_534 = fVar220 + auVar213._12_4_ * auVar195._12_4_;
    fStack_530 = fVar221 + auVar213._16_4_ * auVar195._16_4_;
    fStack_52c = fVar222 + auVar213._20_4_ * auVar195._20_4_;
    fStack_528 = fVar223 + auVar213._24_4_ * auVar195._24_4_;
    register0x0000141c = fVar224 + local_320._28_4_;
    auVar160 = vcmpps_avx(_local_540,ZEXT432(0) << 0x20,6);
    auVar180 = vcmpps_avx(_local_540,auVar88,1);
    auVar160 = vandps_avx(auVar180,auVar160);
    auVar160 = vandps_avx(auVar216,auVar160);
    local_4c0 = vblendvps_avx(auVar119,auVar195,auVar160);
    auVar195 = vrcpps_avx(auVar213);
    fVar189 = auVar195._0_4_;
    fVar198 = auVar195._4_4_;
    auVar57._4_4_ = auVar213._4_4_ * fVar198;
    auVar57._0_4_ = auVar213._0_4_ * fVar189;
    fVar199 = auVar195._8_4_;
    auVar57._8_4_ = auVar213._8_4_ * fVar199;
    fVar200 = auVar195._12_4_;
    auVar57._12_4_ = auVar213._12_4_ * fVar200;
    fVar201 = auVar195._16_4_;
    auVar57._16_4_ = auVar213._16_4_ * fVar201;
    fVar202 = auVar195._20_4_;
    auVar57._20_4_ = auVar213._20_4_ * fVar202;
    fVar203 = auVar195._24_4_;
    auVar57._24_4_ = auVar213._24_4_ * fVar203;
    auVar57._28_4_ = auVar160._28_4_;
    auVar48 = vsubps_avx(auVar170,auVar57);
    fVar189 = fVar189 + fVar189 * auVar48._0_4_;
    fVar198 = fVar198 + fVar198 * auVar48._4_4_;
    fVar199 = fVar199 + fVar199 * auVar48._8_4_;
    fVar200 = fVar200 + fVar200 * auVar48._12_4_;
    fVar201 = fVar201 + fVar201 * auVar48._16_4_;
    fVar202 = fVar202 + fVar202 * auVar48._20_4_;
    fVar203 = fVar203 + fVar203 * auVar48._24_4_;
    auVar58._4_4_ = auVar213._4_4_ * fVar15;
    auVar58._0_4_ = auVar213._0_4_ * fVar128;
    auVar58._8_4_ = auVar213._8_4_ * fVar21;
    auVar58._12_4_ = auVar213._12_4_ * fVar27;
    auVar58._16_4_ = auVar213._16_4_ * fVar33;
    auVar58._20_4_ = auVar213._20_4_ * fVar39;
    auVar58._24_4_ = auVar213._24_4_ * fVar45;
    auVar58._28_4_ = auVar48._28_4_;
    auVar59._4_4_ = local_300 * fVar218;
    auVar59._0_4_ = local_300 * fVar215;
    auVar59._8_4_ = local_300 * fVar219;
    auVar59._12_4_ = local_300 * fVar220;
    auVar59._16_4_ = local_300 * fVar221;
    auVar59._20_4_ = local_300 * fVar222;
    auVar59._24_4_ = local_300 * fVar223;
    auVar59._28_4_ = auVar180._28_4_;
    auVar160 = vsubps_avx(auVar58,auVar59);
    auVar60._4_4_ = auVar213._4_4_ * fVar14;
    auVar60._0_4_ = auVar213._0_4_ * fVar125;
    auVar60._8_4_ = auVar213._8_4_ * fVar20;
    auVar60._12_4_ = auVar213._12_4_ * fVar26;
    auVar60._16_4_ = auVar213._16_4_ * fVar32;
    auVar60._20_4_ = auVar213._20_4_ * fVar38;
    auVar60._24_4_ = auVar213._24_4_ * fVar44;
    auVar60._28_4_ = auVar180._28_4_;
    auVar61._4_4_ = local_580 * fVar218;
    auVar61._0_4_ = local_580 * fVar215;
    auVar61._8_4_ = local_580 * fVar219;
    auVar61._12_4_ = local_580 * fVar220;
    auVar61._16_4_ = local_580 * fVar221;
    auVar61._20_4_ = local_580 * fVar222;
    auVar61._24_4_ = local_580 * fVar223;
    auVar61._28_4_ = auVar226._28_4_;
    auVar180 = vsubps_avx(auVar60,auVar61);
    auVar62._4_4_ = auVar213._4_4_ * fVar13;
    auVar62._0_4_ = auVar213._0_4_ * fVar113;
    auVar62._8_4_ = auVar213._8_4_ * fVar19;
    auVar62._12_4_ = auVar213._12_4_ * fVar25;
    auVar62._16_4_ = auVar213._16_4_ * fVar31;
    auVar62._20_4_ = auVar213._20_4_ * fVar37;
    auVar62._24_4_ = auVar213._24_4_ * fVar43;
    auVar62._28_4_ = auVar226._28_4_;
    auVar63._4_4_ = fVar218 * local_260;
    auVar63._0_4_ = fVar215 * local_260;
    auVar63._8_4_ = fVar219 * local_260;
    auVar63._12_4_ = fVar220 * local_260;
    auVar63._16_4_ = fVar221 * local_260;
    auVar63._20_4_ = fVar222 * local_260;
    auVar63._24_4_ = fVar223 * local_260;
    auVar63._28_4_ = 0xff800000;
    auVar226 = vsubps_avx(auVar62,auVar63);
    fVar64 = auVar226._28_4_;
    fVar176 = auVar180._28_4_ + fVar64;
    auVar143._0_4_ =
         auVar160._0_4_ * auVar160._0_4_ +
         auVar180._0_4_ * auVar180._0_4_ + auVar226._0_4_ * auVar226._0_4_;
    auVar143._4_4_ =
         auVar160._4_4_ * auVar160._4_4_ +
         auVar180._4_4_ * auVar180._4_4_ + auVar226._4_4_ * auVar226._4_4_;
    auVar143._8_4_ =
         auVar160._8_4_ * auVar160._8_4_ +
         auVar180._8_4_ * auVar180._8_4_ + auVar226._8_4_ * auVar226._8_4_;
    auVar143._12_4_ =
         auVar160._12_4_ * auVar160._12_4_ +
         auVar180._12_4_ * auVar180._12_4_ + auVar226._12_4_ * auVar226._12_4_;
    auVar143._16_4_ =
         auVar160._16_4_ * auVar160._16_4_ +
         auVar180._16_4_ * auVar180._16_4_ + auVar226._16_4_ * auVar226._16_4_;
    auVar143._20_4_ =
         auVar160._20_4_ * auVar160._20_4_ +
         auVar180._20_4_ * auVar180._20_4_ + auVar226._20_4_ * auVar226._20_4_;
    auVar143._24_4_ =
         auVar160._24_4_ * auVar160._24_4_ +
         auVar180._24_4_ * auVar180._24_4_ + auVar226._24_4_ * auVar226._24_4_;
    auVar143._28_4_ = auVar160._28_4_ + fVar176;
    auVar65._4_4_ = fVar148 * fVar183 * fVar183;
    auVar65._0_4_ = fVar139 * fVar112 * fVar112;
    auVar65._8_4_ = fVar149 * fVar184 * fVar184;
    auVar65._12_4_ = fVar150 * fVar185 * fVar185;
    auVar65._16_4_ = fVar151 * fVar186 * fVar186;
    auVar65._20_4_ = fVar152 * fVar187 * fVar187;
    auVar65._24_4_ = fVar153 * fVar188 * fVar188;
    auVar65._28_4_ = fVar176;
    auVar160 = vcmpps_avx(auVar143,auVar65,1);
    auVar66._4_4_ = fVar198 * -fVar218;
    auVar66._0_4_ = fVar189 * -fVar215;
    auVar66._8_4_ = fVar199 * -fVar219;
    auVar66._12_4_ = fVar200 * -fVar220;
    auVar66._16_4_ = fVar201 * -fVar221;
    auVar66._20_4_ = fVar202 * -fVar222;
    auVar66._24_4_ = fVar203 * -fVar223;
    auVar66._28_4_ = -fVar224;
    auVar180 = vblendvps_avx(auVar158,auVar66,auVar160);
    auVar174._12_4_ = fStack_214;
    auVar174._0_12_ = *(undefined1 (*) [12])(mm_lookupmask_ps + uVar92);
    auVar174._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar160 = vandnps_avx(auVar174,auVar216);
    local_5c0 = vblendvps_avx(auVar158,auVar180,auVar160);
    auVar144._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar144._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar155._0_4_ = auVar213._0_4_ * auVar230._0_4_;
    auVar155._4_4_ = auVar213._4_4_ * auVar230._4_4_;
    auVar155._8_4_ = auVar213._8_4_ * auVar230._8_4_;
    auVar155._12_4_ = auVar213._12_4_ * auVar230._12_4_;
    auVar155._16_4_ = auVar213._16_4_ * auVar230._16_4_;
    auVar155._20_4_ = auVar213._20_4_ * auVar230._20_4_;
    auVar155._24_4_ = auVar213._24_4_ * auVar230._24_4_;
    auVar155._28_4_ = 0;
    auVar67._4_4_ = auVar213._4_4_ * auVar97._4_4_;
    auVar67._0_4_ = auVar213._0_4_ * auVar97._0_4_;
    auVar67._8_4_ = auVar213._8_4_ * auVar97._8_4_;
    auVar67._12_4_ = auVar213._12_4_ * auVar97._12_4_;
    auVar67._16_4_ = auVar213._16_4_ * auVar97._16_4_;
    auVar67._20_4_ = auVar213._20_4_ * auVar97._20_4_;
    auVar67._24_4_ = auVar213._24_4_ * auVar97._24_4_;
    auVar67._28_4_ = auVar160._28_4_;
    auVar68._4_4_ = auVar213._4_4_ * auVar47._4_4_;
    auVar68._0_4_ = auVar213._0_4_ * auVar47._0_4_;
    auVar68._8_4_ = auVar213._8_4_ * auVar47._8_4_;
    auVar68._12_4_ = auVar213._12_4_ * auVar47._12_4_;
    auVar68._16_4_ = auVar213._16_4_ * auVar47._16_4_;
    auVar68._20_4_ = auVar213._20_4_ * auVar47._20_4_;
    auVar68._24_4_ = auVar213._24_4_ * auVar47._24_4_;
    auVar68._28_4_ = 0;
    fStack_2fc = local_300;
    fStack_2f8 = local_300;
    fStack_2f4 = local_300;
    fStack_2f0 = local_300;
    fStack_2ec = local_300;
    fStack_2e8 = local_300;
    fStack_2e4 = local_300;
    auVar69._4_4_ = local_300 * fVar233;
    auVar69._0_4_ = local_300 * fVar229;
    auVar69._8_4_ = local_300 * fVar235;
    auVar69._12_4_ = local_300 * fVar237;
    auVar69._16_4_ = local_300 * fVar239;
    auVar69._20_4_ = local_300 * fVar241;
    auVar69._24_4_ = local_300 * fVar243;
    auVar69._28_4_ = fVar64;
    auVar160 = vsubps_avx(auVar155,auVar69);
    auVar70._4_4_ = local_580 * fVar233;
    auVar70._0_4_ = local_580 * fVar229;
    auVar70._8_4_ = local_580 * fVar235;
    auVar70._12_4_ = local_580 * fVar237;
    auVar70._16_4_ = local_580 * fVar239;
    auVar70._20_4_ = local_580 * fVar241;
    auVar70._24_4_ = local_580 * fVar243;
    auVar70._28_4_ = fVar64;
    auVar180 = vsubps_avx(auVar67,auVar70);
    auVar71._4_4_ = fVar233 * local_260;
    auVar71._0_4_ = fVar229 * local_260;
    auVar71._8_4_ = fVar235 * local_260;
    auVar71._12_4_ = fVar237 * local_260;
    auVar71._16_4_ = fVar239 * local_260;
    auVar71._20_4_ = fVar241 * local_260;
    auVar71._24_4_ = fVar243 * local_260;
    auVar71._28_4_ = fVar64;
    auVar226 = vsubps_avx(auVar68,auVar71);
    auVar120._0_4_ =
         auVar160._0_4_ * auVar160._0_4_ +
         auVar180._0_4_ * auVar180._0_4_ + auVar226._0_4_ * auVar226._0_4_;
    auVar120._4_4_ =
         auVar160._4_4_ * auVar160._4_4_ +
         auVar180._4_4_ * auVar180._4_4_ + auVar226._4_4_ * auVar226._4_4_;
    auVar120._8_4_ =
         auVar160._8_4_ * auVar160._8_4_ +
         auVar180._8_4_ * auVar180._8_4_ + auVar226._8_4_ * auVar226._8_4_;
    auVar120._12_4_ =
         auVar160._12_4_ * auVar160._12_4_ +
         auVar180._12_4_ * auVar180._12_4_ + auVar226._12_4_ * auVar226._12_4_;
    auVar120._16_4_ =
         auVar160._16_4_ * auVar160._16_4_ +
         auVar180._16_4_ * auVar180._16_4_ + auVar226._16_4_ * auVar226._16_4_;
    auVar120._20_4_ =
         auVar160._20_4_ * auVar160._20_4_ +
         auVar180._20_4_ * auVar180._20_4_ + auVar226._20_4_ * auVar226._20_4_;
    auVar120._24_4_ =
         auVar160._24_4_ * auVar160._24_4_ +
         auVar180._24_4_ * auVar180._24_4_ + auVar226._24_4_ * auVar226._24_4_;
    auVar120._28_4_ = auVar160._28_4_ + auVar180._28_4_ + auVar226._28_4_;
    local_5a0._0_4_ = auVar98._0_4_;
    local_5a0._4_4_ = auVar98._4_4_;
    fStack_598 = auVar98._8_4_;
    fStack_594 = auVar98._12_4_;
    fStack_590 = auVar98._16_4_;
    fStack_58c = auVar98._20_4_;
    fStack_588 = auVar98._24_4_;
    uStack_584 = auVar98._28_4_;
    auVar72._4_4_ = fVar148 * (float)local_5a0._4_4_ * (float)local_5a0._4_4_;
    auVar72._0_4_ = fVar139 * (float)local_5a0._0_4_ * (float)local_5a0._0_4_;
    auVar72._8_4_ = fVar149 * fStack_598 * fStack_598;
    auVar72._12_4_ = fVar150 * fStack_594 * fStack_594;
    auVar72._16_4_ = fVar151 * fStack_590 * fStack_590;
    auVar72._20_4_ = fVar152 * fStack_58c * fStack_58c;
    auVar72._24_4_ = fVar153 * fStack_588 * fStack_588;
    auVar72._28_4_ = uStack_584;
    auVar180 = vcmpps_avx(auVar120,auVar72,1);
    auVar96 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
    auVar160 = vandnps_avx(auVar144,auVar216);
    auVar73._4_4_ = fVar198 * -fVar233;
    auVar73._0_4_ = fVar189 * -fVar229;
    auVar73._8_4_ = fVar199 * -fVar235;
    auVar73._12_4_ = fVar200 * -fVar237;
    auVar73._16_4_ = fVar201 * -fVar239;
    auVar73._20_4_ = fVar202 * -fVar241;
    auVar73._24_4_ = fVar203 * -fVar243;
    auVar73._28_4_ = auVar195._28_4_ + auVar48._28_4_;
    auVar180 = vblendvps_avx(auVar158,auVar73,auVar180);
    auVar160 = vblendvps_avx(auVar158,auVar180,auVar160);
    auVar195 = vmaxps_avx(local_5c0,auVar160);
    auVar180 = vcmpps_avx(auVar158,auVar195,0);
    auVar171._8_4_ = 0xff800000;
    auVar171._0_8_ = 0xff800000ff800000;
    auVar171._12_4_ = 0xff800000;
    auVar171._16_4_ = 0xff800000;
    auVar171._20_4_ = 0xff800000;
    auVar171._24_4_ = 0xff800000;
    auVar171._28_4_ = 0xff800000;
    auVar180 = vblendvps_avx(auVar195,auVar171,auVar180);
    auVar195 = vminps_avx(local_5c0,auVar160);
    auVar160 = vcmpps_avx(auVar158,auVar195,0);
    auVar160 = vblendvps_avx(auVar195,auVar171,auVar160);
    auVar226 = vminps_avx(local_320,auVar195);
    auVar195 = vcmpps_avx(auVar226,auVar195,0);
    auVar160 = vblendvps_avx(auVar160,auVar180,auVar195);
    auVar145._16_16_ = auVar96;
    auVar145._0_16_ = auVar96;
    local_200 = vmaxps_avx(local_4c0,auVar160);
    auVar121._0_4_ = fVar114 + auVar226._0_4_;
    auVar121._4_4_ = fVar126 + auVar226._4_4_;
    auVar121._8_4_ = fVar129 + auVar226._8_4_;
    auVar121._12_4_ = fVar132 + auVar226._12_4_;
    auVar121._16_4_ = fStack_4d0 + auVar226._16_4_;
    auVar121._20_4_ = fStack_4cc + auVar226._20_4_;
    auVar121._24_4_ = fStack_4c8 + auVar226._24_4_;
    auVar121._28_4_ = fStack_4c4 + auVar226._28_4_;
    auVar160 = vcmpps_avx(auVar145,auVar121,2);
    auVar96 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0);
    auVar156._16_16_ = auVar96;
    auVar156._0_16_ = auVar96;
    auVar180 = vcmpps_avx(auVar121,auVar156,2);
    auVar160 = vandps_avx(auVar180,auVar160);
    auVar180 = vcmpps_avx(auVar158,auVar226,4);
    auVar180 = vandps_avx(auVar216,auVar180);
    local_500 = vandps_avx(auVar160,auVar180);
    local_5a0._0_4_ = fVar114 + local_200._0_4_;
    local_5a0._4_4_ = fVar126 + local_200._4_4_;
    fStack_598 = fVar129 + local_200._8_4_;
    fStack_594 = fVar132 + local_200._12_4_;
    fStack_590 = fStack_4d0 + local_200._16_4_;
    fStack_58c = fStack_4cc + local_200._20_4_;
    fStack_588 = fStack_4c8 + local_200._24_4_;
    fStack_1a4 = local_200._28_4_;
    uStack_584 = fStack_4c4 + fStack_1a4;
    auVar160 = vcmpps_avx(auVar145,_local_5a0,2);
    auVar180 = vcmpps_avx(_local_5a0,auVar156,2);
    auVar160 = vandps_avx(auVar180,auVar160);
    auVar180 = vcmpps_avx(auVar171,local_200,4);
    auVar180 = vandps_avx(auVar216,auVar180);
    local_520 = vandps_avx(auVar160,auVar180);
    local_620 = vorps_avx(local_500,local_520);
    if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_620 >> 0x7f,0) != '\0') ||
          (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_620 >> 0xbf,0) != '\0') ||
        (local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_620[0x1f] < '\0') {
      auVar195 = vblendvps_avx(local_200,auVar226,local_500);
      auVar226 = vblendvps_avx(_local_540,auVar179,local_500);
      auVar89._4_4_ = fVar232;
      auVar89._0_4_ = fVar228;
      auVar89._8_4_ = fVar234;
      auVar89._12_4_ = fVar236;
      auVar89._16_4_ = fVar238;
      auVar89._20_4_ = fVar240;
      auVar89._24_4_ = fVar242;
      auVar89._28_4_ = fVar212 + fVar168;
      auVar160 = vrcpps_avx(auVar89);
      local_560 = auVar160._0_4_;
      fStack_55c = auVar160._4_4_;
      auVar74._4_4_ = fVar232 * fStack_55c;
      auVar74._0_4_ = fVar228 * local_560;
      fStack_558 = auVar160._8_4_;
      auVar74._8_4_ = fVar234 * fStack_558;
      fStack_554 = auVar160._12_4_;
      auVar74._12_4_ = fVar236 * fStack_554;
      fStack_550 = auVar160._16_4_;
      auVar74._16_4_ = fVar238 * fStack_550;
      fStack_54c = auVar160._20_4_;
      auVar74._20_4_ = fVar240 * fStack_54c;
      fStack_548 = auVar160._24_4_;
      auVar74._24_4_ = fVar242 * fStack_548;
      auVar74._28_4_ = local_500._28_4_;
      auVar172._8_4_ = 0x3f800000;
      auVar172._0_8_ = &DAT_3f8000003f800000;
      auVar172._12_4_ = 0x3f800000;
      auVar172._16_4_ = 0x3f800000;
      auVar172._20_4_ = 0x3f800000;
      auVar172._24_4_ = 0x3f800000;
      auVar172._28_4_ = 0x3f800000;
      auVar180 = vsubps_avx(auVar172,auVar74);
      local_560 = local_560 + local_560 * auVar180._0_4_;
      fStack_55c = fStack_55c + fStack_55c * auVar180._4_4_;
      fStack_558 = fStack_558 + fStack_558 * auVar180._8_4_;
      fStack_554 = fStack_554 + fStack_554 * auVar180._12_4_;
      fStack_550 = fStack_550 + fStack_550 * auVar180._16_4_;
      fStack_54c = fStack_54c + fStack_54c * auVar180._20_4_;
      fStack_548 = fStack_548 + fStack_548 * auVar180._24_4_;
      fStack_544 = auVar160._28_4_ + auVar180._28_4_;
      fVar112 = fVar228 * fVar131 * fVar112;
      fVar183 = fVar232 * fVar95 * fVar183;
      fVar184 = fVar234 * fVar106 * fVar184;
      fVar185 = fVar236 * fVar107 * fVar185;
      fVar186 = fVar238 * fVar108 * fVar186;
      fVar187 = fVar240 * fVar109 * fVar187;
      fVar188 = fVar242 * fVar110 * fVar188;
      auVar227 = ZEXT3264(local_280);
      auVar160 = vcmpps_avx(auVar195,local_320,0);
      auVar180 = vcmpps_avx(auVar195,local_4c0,0);
      auVar160 = vorps_avx(auVar160,auVar180);
      auVar160 = vandps_avx(auVar216,auVar160);
      auVar230 = vcmpps_avx(local_5c0,auVar195,0);
      auVar180 = vandps_avx(auVar216,auVar230);
      fVar95 = auVar195._0_4_;
      fVar106 = auVar195._4_4_;
      fVar107 = auVar195._8_4_;
      fVar108 = auVar195._12_4_;
      fVar109 = auVar195._16_4_;
      fVar110 = auVar195._20_4_;
      fVar148 = auVar195._24_4_;
      fStack_1dc = fVar12 * fVar183;
      local_1e0 = fVar111 * fVar112;
      fStack_1d8 = fVar18 * fVar184;
      fStack_1d4 = fVar24 * fVar185;
      fStack_1d0 = fVar30 * fVar186;
      fStack_1cc = fVar36 * fVar187;
      fStack_1c8 = fVar42 * fVar188;
      fStack_1c4 = register0x0000141c;
      auVar146._0_4_ = fVar111 * fVar112 + fVar157 * (fVar95 * local_300 + fVar128);
      auVar146._4_4_ = fVar12 * fVar183 + fVar162 * (fVar106 * local_300 + fVar15);
      auVar146._8_4_ = fVar18 * fVar184 + fVar163 * (fVar107 * local_300 + fVar21);
      auVar146._12_4_ = fVar24 * fVar185 + fVar164 * (fVar108 * local_300 + fVar27);
      auVar146._16_4_ = fVar30 * fVar186 + fVar165 * (fVar109 * local_300 + fVar33);
      auVar146._20_4_ = fVar36 * fVar187 + fVar166 * (fVar110 * local_300 + fVar39);
      auVar146._24_4_ = fVar42 * fVar188 + fVar167 * (fVar148 * local_300 + fVar45);
      auVar146._28_4_ = register0x0000141c + auVar230._28_4_ + fStack_184;
      fStack_23c = fVar127 * fVar12;
      local_240 = fVar115 * fVar111;
      fStack_238 = fVar130 * fVar18;
      fStack_234 = fVar133 * fVar24;
      fStack_230 = fVar134 * fVar30;
      fStack_22c = fVar136 * fVar36;
      fStack_228 = fVar138 * fVar42;
      fStack_224 = local_300;
      fVar212 = auVar226._0_4_;
      fVar139 = auVar226._4_4_;
      auVar75._4_4_ = fVar127 * fVar12 * fVar139;
      auVar75._0_4_ = fVar115 * fVar111 * fVar212;
      fVar111 = auVar226._8_4_;
      auVar75._8_4_ = fVar130 * fVar18 * fVar111;
      fVar128 = auVar226._12_4_;
      auVar75._12_4_ = fVar133 * fVar24 * fVar128;
      fVar131 = auVar226._16_4_;
      auVar75._16_4_ = fVar134 * fVar30 * fVar131;
      fVar12 = auVar226._20_4_;
      auVar75._20_4_ = fVar136 * fVar36 * fVar12;
      fVar15 = auVar226._24_4_;
      auVar75._24_4_ = fVar138 * fVar42 * fVar15;
      auVar75._28_4_ = register0x0000141c;
      auVar230 = vsubps_avx(auVar146,auVar75);
      local_220 = fVar211 * fVar112;
      fStack_21c = fVar137 * fVar183;
      fStack_218 = fVar17 * fVar184;
      fStack_214 = fVar23 * fVar185;
      fStack_210 = fVar29 * fVar186;
      fStack_20c = fVar35 * fVar187;
      fStack_208 = fVar41 * fVar188;
      auVar194._0_4_ = fVar211 * fVar112 + fVar157 * (fVar95 * local_580 + fVar125);
      auVar194._4_4_ = fVar137 * fVar183 + fVar162 * (fVar106 * local_580 + fVar14);
      auVar194._8_4_ = fVar17 * fVar184 + fVar163 * (fVar107 * local_580 + fVar20);
      auVar194._12_4_ = fVar23 * fVar185 + fVar164 * (fVar108 * local_580 + fVar26);
      auVar194._16_4_ = fVar29 * fVar186 + fVar165 * (fVar109 * local_580 + fVar32);
      auVar194._20_4_ = fVar35 * fVar187 + fVar166 * (fVar110 * local_580 + fVar38);
      auVar194._24_4_ = fVar41 * fVar188 + fVar167 * (fVar148 * local_580 + fVar44);
      auVar194._28_4_ = fStack_204 + register0x0000141c + (float)local_4a0._28_4_;
      local_2e0 = fVar211 * fVar115;
      fStack_2dc = fVar137 * fVar127;
      fStack_2d8 = fVar17 * fVar130;
      fStack_2d4 = fVar23 * fVar133;
      fStack_2d0 = fVar29 * fVar134;
      fStack_2cc = fVar35 * fVar136;
      fStack_2c8 = fVar41 * fVar138;
      uStack_2c4 = 0x7f800000;
      auVar76._4_4_ = fVar137 * fVar127 * fVar139;
      auVar76._0_4_ = fVar211 * fVar115 * fVar212;
      auVar76._8_4_ = fVar17 * fVar130 * fVar111;
      auVar76._12_4_ = fVar23 * fVar133 * fVar128;
      auVar76._16_4_ = fVar29 * fVar134 * fVar131;
      auVar76._20_4_ = fVar35 * fVar136 * fVar12;
      auVar76._24_4_ = fVar41 * fVar138 * fVar15;
      auVar76._28_4_ = fStack_204;
      auVar97 = vsubps_avx(auVar194,auVar76);
      local_c0._0_8_ = local_600._0_8_ ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar18;
      local_c0._12_4_ = -fVar24;
      local_c0._16_4_ = -fVar30;
      local_c0._20_4_ = -fVar36;
      local_c0._24_4_ = -fVar42;
      local_c0._28_4_ = -local_600._28_4_;
      auVar216 = vblendvps_avx(local_600,local_c0,auVar180);
      local_420 = vblendvps_avx(auVar216,auVar230,auVar160);
      auVar244 = ZEXT3264(local_2a0);
      local_80 = fVar209 * fVar112;
      fStack_7c = fVar135 * fVar183;
      fStack_78 = fVar16 * fVar184;
      fStack_74 = fVar22 * fVar185;
      fStack_70 = fVar28 * fVar186;
      fStack_6c = fVar34 * fVar187;
      fStack_68 = fVar40 * fVar188;
      fStack_64 = auVar216._28_4_;
      auVar159._0_4_ = fVar209 * fVar112 + fVar157 * (fVar113 + local_260 * fVar95);
      auVar159._4_4_ = fVar135 * fVar183 + fVar162 * (fVar13 + local_260 * fVar106);
      auVar159._8_4_ = fVar16 * fVar184 + fVar163 * (fVar19 + local_260 * fVar107);
      auVar159._12_4_ = fVar22 * fVar185 + fVar164 * (fVar25 + local_260 * fVar108);
      auVar159._16_4_ = fVar28 * fVar186 + fVar165 * (fVar31 + local_260 * fVar109);
      auVar159._20_4_ = fVar34 * fVar187 + fVar166 * (fVar37 + local_260 * fVar110);
      auVar159._24_4_ = fVar40 * fVar188 + fVar167 * (fVar43 + local_260 * fVar148);
      auVar159._28_4_ = auVar216._28_4_ + local_2c0._28_4_ + local_c0._28_4_;
      local_1c0 = fVar209 * fVar115;
      fStack_1bc = fVar135 * fVar127;
      fStack_1b8 = fVar16 * fVar130;
      fStack_1b4 = fVar22 * fVar133;
      fStack_1b0 = fVar28 * fVar134;
      fStack_1ac = fVar34 * fVar136;
      fStack_1a8 = fVar40 * fVar138;
      auVar77._4_4_ = fVar135 * fVar127 * fVar139;
      auVar77._0_4_ = fVar209 * fVar115 * fVar212;
      auVar77._8_4_ = fVar16 * fVar130 * fVar111;
      auVar77._12_4_ = fVar22 * fVar133 * fVar128;
      auVar77._16_4_ = fVar28 * fVar134 * fVar131;
      auVar77._20_4_ = fVar34 * fVar136 * fVar12;
      auVar77._24_4_ = fVar40 * fVar138 * fVar15;
      auVar77._28_4_ = fStack_1a4;
      local_e0._0_8_ = local_280._0_8_ ^ 0x8000000080000000;
      local_e0._8_4_ = -fVar17;
      local_e0._12_4_ = -fVar23;
      local_e0._16_4_ = -fVar29;
      local_e0._20_4_ = -fVar35;
      local_e0._24_4_ = -fVar41;
      local_e0._28_4_ = local_280._28_4_ ^ 0x80000000;
      auVar216 = vblendvps_avx(local_280,local_e0,auVar180);
      auVar230 = vsubps_avx(auVar159,auVar77);
      local_400 = vblendvps_avx(auVar216,auVar97,auVar160);
      local_100._0_8_ = local_2a0._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar16;
      local_100._12_4_ = -fVar22;
      local_100._16_4_ = -fVar28;
      local_100._20_4_ = -fVar34;
      local_100._24_4_ = -fVar40;
      local_100._28_4_ = -fVar49;
      auVar216 = vblendvps_avx(local_2a0,local_100,auVar180);
      local_3e0 = vblendvps_avx(auVar216,auVar230,auVar160);
      auVar207._8_4_ = 0x3f800000;
      auVar207._0_8_ = &DAT_3f8000003f800000;
      auVar207._12_4_ = 0x3f800000;
      auVar207._16_4_ = 0x3f800000;
      auVar207._20_4_ = 0x3f800000;
      auVar207._24_4_ = 0x3f800000;
      auVar207._28_4_ = 0x3f800000;
      local_a0 = vblendvps_avx(auVar207,ZEXT832(0) << 0x20,auVar180);
      auVar78._4_4_ = fVar139 * fStack_55c;
      auVar78._0_4_ = fVar212 * local_560;
      auVar78._8_4_ = fVar111 * fStack_558;
      auVar78._12_4_ = fVar128 * fStack_554;
      auVar78._16_4_ = fVar131 * fStack_550;
      auVar78._20_4_ = fVar12 * fStack_54c;
      auVar78._24_4_ = fVar15 * fStack_548;
      auVar78._28_4_ = auVar226._28_4_;
      local_480 = vblendvps_avx(local_a0,auVar78,auVar160);
      local_440._0_4_ = fVar95 + fVar114;
      local_440._4_4_ = fVar106 + fVar126;
      local_440._8_4_ = fVar107 + fVar129;
      local_440._12_4_ = fVar108 + fVar132;
      local_440._16_4_ = fVar109 + fStack_4d0;
      local_440._20_4_ = fVar110 + fStack_4cc;
      local_440._24_4_ = fVar148 + fStack_4c8;
      local_440._28_4_ = auVar195._28_4_ + fStack_4c4;
      auVar210 = ZEXT3264(local_440);
      local_460 = ZEXT832(0) << 0x20;
      auVar103._8_4_ = 0x7f800000;
      auVar103._0_8_ = 0x7f8000007f800000;
      auVar103._12_4_ = 0x7f800000;
      auVar103._16_4_ = 0x7f800000;
      auVar103._20_4_ = 0x7f800000;
      auVar103._24_4_ = 0x7f800000;
      auVar103._28_4_ = 0x7f800000;
      auVar160 = vblendvps_avx(auVar103,local_440,local_620);
      auVar180 = vshufps_avx(auVar160,auVar160,0xb1);
      auVar180 = vminps_avx(auVar160,auVar180);
      auVar195 = vshufpd_avx(auVar180,auVar180,5);
      auVar180 = vminps_avx(auVar180,auVar195);
      auVar195 = vperm2f128_avx(auVar180,auVar180,1);
      auVar180 = vminps_avx(auVar180,auVar195);
      auVar180 = vcmpps_avx(auVar160,auVar180,0);
      auVar195 = local_620 & auVar180;
      auVar182 = ZEXT3264(CONCAT428(local_300,
                                    CONCAT424(local_300,
                                              CONCAT420(local_300,
                                                        CONCAT416(local_300,
                                                                  CONCAT412(local_300,
                                                                            CONCAT48(local_300,
                                                                                     CONCAT44(
                                                  local_300,local_300))))))));
      auVar197 = ZEXT3264(CONCAT428(local_580,
                                    CONCAT424(local_580,
                                              CONCAT420(local_580,
                                                        CONCAT416(local_580,
                                                                  CONCAT412(local_580,
                                                                            CONCAT48(local_580,
                                                                                     CONCAT44(
                                                  local_580,local_580))))))));
      auVar208 = ZEXT3264(CONCAT428(local_260,
                                    CONCAT424(local_260,
                                              CONCAT420(local_260,
                                                        CONCAT416(local_260,
                                                                  CONCAT412(local_260,
                                                                            CONCAT48(local_260,
                                                                                     CONCAT44(
                                                  local_260,local_260))))))));
      auVar217 = ZEXT3264(local_4a0);
      auVar231 = ZEXT3264(local_2c0);
      auVar160 = local_620;
      if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar195 >> 0x7f,0) != '\0') ||
            (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar195 >> 0xbf,0) != '\0') ||
          (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar195[0x1f] < '\0') {
        auVar160 = vandps_avx(auVar180,local_620);
      }
      uVar90 = vmovmskps_avx(auVar160);
      uVar91 = 0;
      if (uVar90 != 0) {
        for (; (uVar90 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
        }
      }
      lVar94 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      auVar160 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar214 = ZEXT3264(auVar160);
      local_4e0 = 1;
      uStack_4dc = 1;
      uStack_4d8 = 1;
      uStack_4d4 = 1;
      auVar161 = ZEXT3264(local_600);
      local_660 = pSVar93;
      local_5e0 = local_620;
      fStack_57c = local_580;
      fStack_578 = local_580;
      fStack_574 = local_580;
      fStack_570 = local_580;
      fStack_56c = local_580;
      fStack_568 = local_580;
      fStack_564 = local_580;
      _local_1a0 = auVar100;
      do {
        auVar195 = auVar197._0_32_;
        auVar180 = auVar182._0_32_;
        local_650.hit = (RTCHitN *)local_3b0;
        local_650.valid = (int *)&local_670;
        auVar230 = auVar231._0_32_;
        auVar216 = auVar217._0_32_;
        auVar205 = auVar208._0_28_;
        auVar97 = auVar244._0_32_;
        auVar226 = auVar227._0_32_;
        auVar160 = auVar161._0_32_;
        uVar92 = (ulong)uVar91;
        uVar91 = *(uint *)(local_180 + uVar92 * 4);
        pGVar10 = (pSVar93->geometries).items[uVar91].ptr;
        local_650.ray = (RTCRayN *)ray;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_620 + uVar92 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar1 = *(undefined4 *)(local_480 + uVar92 * 4);
            uVar2 = *(undefined4 *)(local_460 + uVar92 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_440 + uVar92 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_420 + uVar92 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_400 + uVar92 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_3e0 + uVar92 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar1;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
            *(uint *)(ray + k * 4 + 0x110) = (line->primIDs).field_0.i[uVar92];
            *(uint *)(ray + k * 4 + 0x120) = uVar91;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
LAB_010a4921:
            auVar98 = vandps_avx(local_520,local_500);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar123._4_4_ = uVar1;
            auVar123._0_4_ = uVar1;
            auVar123._8_4_ = uVar1;
            auVar123._12_4_ = uVar1;
            auVar123._16_4_ = uVar1;
            auVar123._20_4_ = uVar1;
            auVar123._24_4_ = uVar1;
            auVar123._28_4_ = uVar1;
            auVar47 = vcmpps_avx(_local_5a0,auVar123,2);
            auVar48 = auVar98 & auVar47;
            if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar48 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar48 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar48 >> 0x7f,0) == '\0') &&
                  (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar48 >> 0xbf,0) == '\0') &&
                (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar48[0x1f]) {
              return;
            }
            auVar48 = vcmpps_avx(local_200,local_5c0,0);
            auVar160 = vblendvps_avx(auVar160,local_c0,auVar48);
            auVar226 = vblendvps_avx(auVar226,local_e0,auVar48);
            auVar97 = vblendvps_avx(auVar97,local_100,auVar48);
            auVar48 = vcmpps_avx(local_200,local_320,0);
            auVar117 = vcmpps_avx(local_200,local_4c0,0);
            auVar48 = vorps_avx(auVar48,auVar117);
            fVar209 = local_200._0_4_;
            fVar211 = local_200._4_4_;
            fVar212 = local_200._8_4_;
            fVar139 = local_200._12_4_;
            fVar111 = local_200._16_4_;
            fVar113 = local_200._20_4_;
            fVar125 = local_200._24_4_;
            auVar175._0_4_ =
                 (float)local_120._0_4_ * (fVar209 * auVar180._0_4_ + (float)local_1a0._0_4_) +
                 local_1e0;
            auVar175._4_4_ =
                 (float)local_120._4_4_ * (fVar211 * auVar180._4_4_ + (float)local_1a0._4_4_) +
                 fStack_1dc;
            auVar175._8_4_ = fStack_118 * (fVar212 * auVar180._8_4_ + fStack_198) + fStack_1d8;
            auVar175._12_4_ = fStack_114 * (fVar139 * auVar180._12_4_ + fStack_194) + fStack_1d4;
            auVar175._16_4_ = fStack_110 * (fVar111 * auVar180._16_4_ + fStack_190) + fStack_1d0;
            auVar175._20_4_ = fStack_10c * (fVar113 * auVar180._20_4_ + fStack_18c) + fStack_1cc;
            auVar175._24_4_ = fStack_108 * (fVar125 * auVar180._24_4_ + fStack_188) + fStack_1c8;
            auVar175._28_4_ = auVar117._28_4_ + fStack_184 + fStack_1c4;
            auVar181._0_4_ =
                 (float)local_120._0_4_ * (auVar216._0_4_ + auVar195._0_4_ * fVar209) + local_220;
            auVar181._4_4_ =
                 (float)local_120._4_4_ * (auVar216._4_4_ + auVar195._4_4_ * fVar211) + fStack_21c;
            auVar181._8_4_ = fStack_118 * (auVar216._8_4_ + auVar195._8_4_ * fVar212) + fStack_218;
            auVar181._12_4_ =
                 fStack_114 * (auVar216._12_4_ + auVar195._12_4_ * fVar139) + fStack_214;
            auVar181._16_4_ =
                 fStack_110 * (auVar216._16_4_ + auVar195._16_4_ * fVar111) + fStack_210;
            auVar181._20_4_ =
                 fStack_10c * (auVar216._20_4_ + auVar195._20_4_ * fVar113) + fStack_20c;
            auVar181._24_4_ =
                 fStack_108 * (auVar216._24_4_ + auVar195._24_4_ * fVar125) + fStack_208;
            auVar181._28_4_ = auVar216._28_4_ + auVar180._28_4_ + fStack_204;
            auVar196._0_4_ =
                 (float)local_120._0_4_ * (auVar230._0_4_ + auVar205._0_4_ * fVar209) + local_80;
            auVar196._4_4_ =
                 (float)local_120._4_4_ * (auVar230._4_4_ + auVar205._4_4_ * fVar211) + fStack_7c;
            auVar196._8_4_ = fStack_118 * (auVar230._8_4_ + auVar205._8_4_ * fVar212) + fStack_78;
            auVar196._12_4_ = fStack_114 * (auVar230._12_4_ + auVar205._12_4_ * fVar139) + fStack_74
            ;
            auVar196._16_4_ = fStack_110 * (auVar230._16_4_ + auVar205._16_4_ * fVar111) + fStack_70
            ;
            auVar196._20_4_ = fStack_10c * (auVar230._20_4_ + auVar205._20_4_ * fVar113) + fStack_6c
            ;
            auVar196._24_4_ = fStack_108 * (auVar230._24_4_ + auVar205._24_4_ * fVar125) + fStack_68
            ;
            auVar196._28_4_ = auVar230._28_4_ + auVar195._28_4_ + fStack_64;
            auVar79._4_4_ = (float)local_540._4_4_ * fStack_23c;
            auVar79._0_4_ = (float)local_540._0_4_ * local_240;
            auVar79._8_4_ = fStack_538 * fStack_238;
            auVar79._12_4_ = fStack_534 * fStack_234;
            auVar79._16_4_ = fStack_530 * fStack_230;
            auVar79._20_4_ = fStack_52c * fStack_22c;
            auVar79._24_4_ = fStack_528 * fStack_228;
            auVar79._28_4_ = uStack_104;
            auVar180 = vsubps_avx(auVar175,auVar79);
            auVar80._4_4_ = (float)local_540._4_4_ * fStack_2dc;
            auVar80._0_4_ = (float)local_540._0_4_ * local_2e0;
            auVar80._8_4_ = fStack_538 * fStack_2d8;
            auVar80._12_4_ = fStack_534 * fStack_2d4;
            auVar80._16_4_ = fStack_530 * fStack_2d0;
            auVar80._20_4_ = fStack_52c * fStack_2cc;
            auVar80._24_4_ = fStack_528 * fStack_2c8;
            auVar80._28_4_ = uStack_104;
            auVar195 = vsubps_avx(auVar181,auVar80);
            auVar204._0_4_ = (float)local_540._0_4_ * local_1c0;
            auVar204._4_4_ = (float)local_540._4_4_ * fStack_1bc;
            auVar204._8_4_ = fStack_538 * fStack_1b8;
            auVar204._12_4_ = fStack_534 * fStack_1b4;
            auVar81._16_4_ = fStack_530 * fStack_1b0;
            auVar81._0_16_ = auVar204;
            auVar81._20_4_ = fStack_52c * fStack_1ac;
            auVar81._24_4_ = fStack_528 * fStack_1a8;
            auVar81._28_4_ = uStack_104;
            auVar216 = vsubps_avx(auVar196,auVar81);
            local_420 = vblendvps_avx(auVar160,auVar180,auVar48);
            local_400 = vblendvps_avx(auVar226,auVar195,auVar48);
            local_3e0 = vblendvps_avx(auVar97,auVar216,auVar48);
            auVar82._4_4_ = (float)local_540._4_4_ * fStack_55c;
            auVar82._0_4_ = (float)local_540._0_4_ * local_560;
            auVar82._8_4_ = fStack_538 * fStack_558;
            auVar82._12_4_ = fStack_534 * fStack_554;
            auVar82._16_4_ = fStack_530 * fStack_550;
            auVar82._20_4_ = fStack_52c * fStack_54c;
            auVar82._24_4_ = fStack_528 * fStack_548;
            auVar82._28_4_ = auVar180._28_4_;
            local_480 = vblendvps_avx(local_a0,auVar82,auVar48);
            local_620 = vandps_avx(auVar47,auVar98);
            local_460 = ZEXT832(0) << 0x20;
            local_440 = _local_5a0;
            auVar147._8_4_ = 0x7f800000;
            auVar147._0_8_ = 0x7f8000007f800000;
            auVar147._12_4_ = 0x7f800000;
            auVar147._16_4_ = 0x7f800000;
            auVar147._20_4_ = 0x7f800000;
            auVar147._24_4_ = 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar160 = vblendvps_avx(auVar147,_local_5a0,local_620);
            auVar180 = vshufps_avx(auVar160,auVar160,0xb1);
            auVar180 = vminps_avx(auVar160,auVar180);
            auVar195 = vshufpd_avx(auVar180,auVar180,5);
            auVar180 = vminps_avx(auVar180,auVar195);
            auVar195 = vperm2f128_avx(auVar180,auVar180,1);
            auVar180 = vminps_avx(auVar180,auVar195);
            auVar180 = vcmpps_avx(auVar160,auVar180,0);
            pSVar93 = context->scene;
            auVar195 = local_620 & auVar180;
            auVar160 = local_620;
            if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar195 >> 0x7f,0) != '\0') ||
                  (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar195 >> 0xbf,0) != '\0') ||
                (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar195[0x1f] < '\0') {
              auVar160 = vandps_avx(auVar180,local_620);
            }
            uVar90 = vmovmskps_avx(auVar160);
            uVar91 = 0;
            if (uVar90 != 0) {
              for (; (uVar90 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
              }
            }
            lVar94 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
            auVar160 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar182 = ZEXT3264(auVar160);
            auVar197 = ZEXT864(0) << 0x20;
            auVar96 = vpcmpeqd_avx(auVar204,auVar204);
            auVar208 = ZEXT1664(auVar96);
            do {
              local_650.hit = (RTCHitN *)local_3b0;
              local_650.valid = (int *)&local_670;
              uVar92 = (ulong)uVar91;
              uVar91 = *(uint *)(local_180 + uVar92 * 4);
              pGVar10 = (pSVar93->geometries).items[uVar91].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_620 + uVar92 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar1 = *(undefined4 *)(local_480 + uVar92 * 4);
                  uVar2 = *(undefined4 *)(local_460 + uVar92 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_440 + uVar92 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_420 + uVar92 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_400 + uVar92 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_3e0 + uVar92 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                  *(uint *)(ray + k * 4 + 0x110) = (line->primIDs).field_0.i[uVar92];
                  *(uint *)(ray + k * 4 + 0x120) = uVar91;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  return;
                }
                local_380 = *(undefined4 *)(local_480 + uVar92 * 4);
                local_370 = *(undefined4 *)(local_460 + uVar92 * 4);
                local_350 = vpshufd_avx(ZEXT416(uVar91),0);
                local_360._4_4_ = (line->primIDs).field_0.i[uVar92];
                uVar1 = *(undefined4 *)(local_420 + uVar92 * 4);
                local_3b0._4_4_ = uVar1;
                local_3b0._0_4_ = uVar1;
                local_3b0._8_4_ = uVar1;
                local_3b0._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(local_400 + uVar92 * 4);
                local_3a0._4_4_ = uVar1;
                local_3a0._0_4_ = uVar1;
                local_3a0._8_4_ = uVar1;
                local_3a0._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(local_3e0 + uVar92 * 4);
                local_390._4_4_ = uVar1;
                local_390._0_4_ = uVar1;
                local_390._8_4_ = uVar1;
                local_390._12_4_ = uVar1;
                uStack_37c = local_380;
                uStack_378 = local_380;
                uStack_374 = local_380;
                uStack_36c = local_370;
                uStack_368 = local_370;
                uStack_364 = local_370;
                local_360._0_4_ = local_360._4_4_;
                local_360._8_4_ = local_360._4_4_;
                local_360._12_4_ = local_360._4_4_;
                local_600 = auVar182._0_32_;
                uStack_33c = context->user->instID[0];
                local_340 = uStack_33c;
                uStack_338 = uStack_33c;
                uStack_334 = uStack_33c;
                uStack_330 = context->user->instPrimID[0];
                uStack_32c = uStack_330;
                uStack_328 = uStack_330;
                uStack_324 = uStack_330;
                local_580 = *(float *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_440 + uVar92 * 4);
                local_670 = *(undefined8 *)(mm_lookupmask_ps + lVar94);
                uStack_668 = *(undefined8 *)(mm_lookupmask_ps + lVar94 + 8);
                local_650.geometryUserPtr = pGVar10->userPtr;
                local_650.context = context->user;
                local_650.N = 4;
                local_5c0._0_8_ = pSVar93;
                local_650.ray = (RTCRayN *)ray;
                if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  local_5e0._0_8_ = line;
                  auVar96 = auVar208._0_16_;
                  (*pGVar10->intersectionFilterN)(&local_650);
                  auVar96 = vpcmpeqd_avx(auVar96,auVar96);
                  auVar208 = ZEXT1664(auVar96);
                  auVar197 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar182 = ZEXT3264(local_600);
                  line = (Primitive *)local_5e0._0_8_;
                  pSVar93 = (Scene *)local_5c0._0_8_;
                }
                auVar85._8_8_ = uStack_668;
                auVar85._0_8_ = local_670;
                auVar96 = auVar208._0_16_;
                if (auVar85 == (undefined1  [16])0x0) {
                  auVar116 = vpcmpeqd_avx(auVar197._0_16_,(undefined1  [16])0x0);
                  auVar96 = auVar96 ^ auVar116;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var11)(&local_650);
                    auVar96 = vpcmpeqd_avx(auVar96,auVar96);
                    auVar208 = ZEXT1664(auVar96);
                    auVar197 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar182 = ZEXT3264(local_600);
                    pSVar93 = (Scene *)local_5c0._0_8_;
                  }
                  auVar86._8_8_ = uStack_668;
                  auVar86._0_8_ = local_670;
                  auVar116 = vpcmpeqd_avx(auVar197._0_16_,auVar86);
                  auVar96 = auVar208._0_16_ ^ auVar116;
                  if (auVar86 != (undefined1  [16])0x0) {
                    auVar116 = auVar208._0_16_ ^ auVar116;
                    auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])local_650.hit);
                    *(undefined1 (*) [16])(local_650.ray + 0xc0) = auVar46;
                    auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x10));
                    *(undefined1 (*) [16])(local_650.ray + 0xd0) = auVar46;
                    auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x20));
                    *(undefined1 (*) [16])(local_650.ray + 0xe0) = auVar46;
                    auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x30));
                    *(undefined1 (*) [16])(local_650.ray + 0xf0) = auVar46;
                    auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x40));
                    *(undefined1 (*) [16])(local_650.ray + 0x100) = auVar46;
                    auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x50));
                    *(undefined1 (*) [16])(local_650.ray + 0x110) = auVar46;
                    auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x60));
                    *(undefined1 (*) [16])(local_650.ray + 0x120) = auVar46;
                    auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x70));
                    *(undefined1 (*) [16])(local_650.ray + 0x130) = auVar46;
                    auVar116 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_650.ray + 0x140) = auVar116;
                  }
                }
                auVar87._4_4_ = uStack_4dc;
                auVar87._0_4_ = local_4e0;
                auVar87._8_4_ = uStack_4d8;
                auVar87._12_4_ = uStack_4d4;
                if ((auVar87 & auVar96) == (undefined1  [16])0x0) {
                  *(float *)(ray + k * 4 + 0x80) = local_580;
                }
                *(undefined4 *)(local_620 + uVar92 * 4) = 0;
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar105._4_4_ = uVar1;
                auVar105._0_4_ = uVar1;
                auVar105._8_4_ = uVar1;
                auVar105._12_4_ = uVar1;
                auVar105._16_4_ = uVar1;
                auVar105._20_4_ = uVar1;
                auVar105._24_4_ = uVar1;
                auVar105._28_4_ = uVar1;
                auVar160 = vcmpps_avx(_local_5a0,auVar105,2);
                local_620 = vandps_avx(auVar160,local_620);
              }
              if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_620 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_620 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_620 >> 0x7f,0) == '\0') &&
                    (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_620 >> 0xbf,0) == '\0') &&
                  (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_620[0x1f]) {
                return;
              }
              auVar124._8_4_ = 0x7f800000;
              auVar124._0_8_ = 0x7f8000007f800000;
              auVar124._12_4_ = 0x7f800000;
              auVar124._16_4_ = 0x7f800000;
              auVar124._20_4_ = 0x7f800000;
              auVar124._24_4_ = 0x7f800000;
              auVar124._28_4_ = 0x7f800000;
              auVar160 = vblendvps_avx(auVar124,_local_5a0,local_620);
              auVar180 = vshufps_avx(auVar160,auVar160,0xb1);
              auVar180 = vminps_avx(auVar160,auVar180);
              auVar195 = vshufpd_avx(auVar180,auVar180,5);
              auVar180 = vminps_avx(auVar180,auVar195);
              auVar195 = vperm2f128_avx(auVar180,auVar180,1);
              auVar180 = vminps_avx(auVar180,auVar195);
              auVar180 = vcmpps_avx(auVar160,auVar180,0);
              auVar195 = local_620 & auVar180;
              auVar160 = local_620;
              if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar195 >> 0x7f,0) != '\0') ||
                    (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar195 >> 0xbf,0) != '\0') ||
                  (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar195[0x1f] < '\0') {
                auVar160 = vandps_avx(auVar180,local_620);
              }
              uVar90 = vmovmskps_avx(auVar160);
              uVar91 = 0;
              if (uVar90 != 0) {
                for (; (uVar90 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
                }
              }
            } while( true );
          }
          local_380 = *(undefined4 *)(local_480 + uVar92 * 4);
          local_370 = *(undefined4 *)(local_460 + uVar92 * 4);
          local_350 = vpshufd_avx(ZEXT416(uVar91),0);
          uVar91 = (line->primIDs).field_0.i[uVar92];
          auVar96._4_4_ = uVar91;
          auVar96._0_4_ = uVar91;
          auVar96._8_4_ = uVar91;
          auVar96._12_4_ = uVar91;
          local_3b0._4_4_ = *(undefined4 *)(local_420 + uVar92 * 4);
          uVar1 = *(undefined4 *)(local_400 + uVar92 * 4);
          local_3a0._4_4_ = uVar1;
          local_3a0._0_4_ = uVar1;
          local_3a0._8_4_ = uVar1;
          local_3a0._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_3e0 + uVar92 * 4);
          local_390._4_4_ = uVar1;
          local_390._0_4_ = uVar1;
          local_390._8_4_ = uVar1;
          local_390._12_4_ = uVar1;
          local_3b0._0_4_ = local_3b0._4_4_;
          local_3b0._8_4_ = local_3b0._4_4_;
          local_3b0._12_4_ = local_3b0._4_4_;
          uStack_37c = local_380;
          uStack_378 = local_380;
          uStack_374 = local_380;
          uStack_36c = local_370;
          uStack_368 = local_370;
          uStack_364 = local_370;
          local_360 = auVar96;
          uStack_33c = context->user->instID[0];
          local_340 = uStack_33c;
          uStack_338 = uStack_33c;
          uStack_334 = uStack_33c;
          uStack_330 = context->user->instPrimID[0];
          uStack_32c = uStack_330;
          uStack_328 = uStack_330;
          uStack_324 = uStack_330;
          local_654 = *(undefined4 *)(ray + k * 4 + 0x80);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_440 + uVar92 * 4);
          local_670 = *(undefined8 *)(mm_lookupmask_ps + lVar94);
          uStack_668 = *(undefined8 *)(mm_lookupmask_ps + lVar94 + 8);
          local_650.geometryUserPtr = pGVar10->userPtr;
          local_650.context = context->user;
          local_650.N = 4;
          local_140 = auVar210._0_32_;
          local_160 = auVar214._0_32_;
          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_5e0._0_8_ = line;
            (*pGVar10->intersectionFilterN)(&local_650);
            auVar214 = ZEXT3264(local_160);
            auVar210 = ZEXT3264(local_140);
            auVar231 = ZEXT3264(local_2c0);
            auVar217 = ZEXT3264(local_4a0);
            auVar244 = ZEXT3264(local_2a0);
            auVar227 = ZEXT3264(local_280);
            auVar208 = ZEXT3264(CONCAT428(fStack_244,
                                          CONCAT424(fStack_248,
                                                    CONCAT420(fStack_24c,
                                                              CONCAT416(fStack_250,
                                                                        CONCAT412(fStack_254,
                                                                                  CONCAT48(
                                                  fStack_258,CONCAT44(fStack_25c,local_260))))))));
            auVar197 = ZEXT3264(CONCAT428(fStack_564,
                                          CONCAT424(fStack_568,
                                                    CONCAT420(fStack_56c,
                                                              CONCAT416(fStack_570,
                                                                        CONCAT412(fStack_574,
                                                                                  CONCAT48(
                                                  fStack_578,CONCAT44(fStack_57c,local_580))))))));
            auVar182 = ZEXT3264(CONCAT428(fStack_2e4,
                                          CONCAT424(fStack_2e8,
                                                    CONCAT420(fStack_2ec,
                                                              CONCAT416(fStack_2f0,
                                                                        CONCAT412(fStack_2f4,
                                                                                  CONCAT48(
                                                  fStack_2f8,CONCAT44(fStack_2fc,local_300))))))));
            line = (Primitive *)local_5e0._0_8_;
            pSVar93 = local_660;
          }
          auVar116._8_8_ = uStack_668;
          auVar116._0_8_ = local_670;
          if (auVar116 == (undefined1  [16])0x0) {
            auVar116 = ZEXT816(0) << 0x40;
            auVar96 = vpcmpeqd_avx((undefined1  [16])0x0,auVar116);
            auVar116 = vpcmpeqd_avx(auVar116,auVar116);
            auVar96 = auVar96 ^ auVar116;
            auVar161 = ZEXT3264(local_600);
          }
          else {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var11)(&local_650);
              auVar214 = ZEXT3264(local_160);
              auVar210 = ZEXT3264(local_140);
              auVar231 = ZEXT3264(local_2c0);
              auVar217 = ZEXT3264(local_4a0);
              auVar244 = ZEXT3264(local_2a0);
              auVar227 = ZEXT3264(local_280);
              auVar208 = ZEXT3264(CONCAT428(fStack_244,
                                            CONCAT424(fStack_248,
                                                      CONCAT420(fStack_24c,
                                                                CONCAT416(fStack_250,
                                                                          CONCAT412(fStack_254,
                                                                                    CONCAT48(
                                                  fStack_258,CONCAT44(fStack_25c,local_260))))))));
              auVar197 = ZEXT3264(CONCAT428(fStack_564,
                                            CONCAT424(fStack_568,
                                                      CONCAT420(fStack_56c,
                                                                CONCAT416(fStack_570,
                                                                          CONCAT412(fStack_574,
                                                                                    CONCAT48(
                                                  fStack_578,CONCAT44(fStack_57c,local_580))))))));
              auVar182 = ZEXT3264(CONCAT428(fStack_2e4,
                                            CONCAT424(fStack_2e8,
                                                      CONCAT420(fStack_2ec,
                                                                CONCAT416(fStack_2f0,
                                                                          CONCAT412(fStack_2f4,
                                                                                    CONCAT48(
                                                  fStack_2f8,CONCAT44(fStack_2fc,local_300))))))));
              pSVar93 = local_660;
            }
            auVar84._8_8_ = uStack_668;
            auVar84._0_8_ = local_670;
            auVar116 = vpcmpeqd_avx(auVar84,(undefined1  [16])0x0);
            auVar46 = vpcmpeqd_avx(auVar96,auVar96);
            auVar96 = auVar116 ^ auVar46;
            auVar161 = ZEXT3264(local_600);
            if (auVar84 != (undefined1  [16])0x0) {
              auVar116 = auVar116 ^ auVar46;
              auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])local_650.hit);
              *(undefined1 (*) [16])(local_650.ray + 0xc0) = auVar46;
              auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x10));
              *(undefined1 (*) [16])(local_650.ray + 0xd0) = auVar46;
              auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x20));
              *(undefined1 (*) [16])(local_650.ray + 0xe0) = auVar46;
              auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x30));
              *(undefined1 (*) [16])(local_650.ray + 0xf0) = auVar46;
              auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x40));
              *(undefined1 (*) [16])(local_650.ray + 0x100) = auVar46;
              auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x50));
              *(undefined1 (*) [16])(local_650.ray + 0x110) = auVar46;
              auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x60));
              *(undefined1 (*) [16])(local_650.ray + 0x120) = auVar46;
              auVar46 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x70));
              *(undefined1 (*) [16])(local_650.ray + 0x130) = auVar46;
              auVar116 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])(local_650.hit + 0x80));
              *(undefined1 (*) [16])(local_650.ray + 0x140) = auVar116;
            }
          }
          auVar46._4_4_ = uStack_4dc;
          auVar46._0_4_ = local_4e0;
          auVar46._8_4_ = uStack_4d8;
          auVar46._12_4_ = uStack_4d4;
          if ((auVar46 & auVar96) == (undefined1  [16])0x0) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_654;
          }
          *(undefined4 *)(local_620 + uVar92 * 4) = 0;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar104._4_4_ = uVar1;
          auVar104._0_4_ = uVar1;
          auVar104._8_4_ = uVar1;
          auVar104._12_4_ = uVar1;
          auVar104._16_4_ = uVar1;
          auVar104._20_4_ = uVar1;
          auVar104._24_4_ = uVar1;
          auVar104._28_4_ = uVar1;
          auVar160 = vcmpps_avx(auVar210._0_32_,auVar104,2);
          local_620 = vandps_avx(auVar160,local_620);
        }
        auVar195 = auVar197._0_32_;
        auVar180 = auVar182._0_32_;
        auVar230 = auVar231._0_32_;
        auVar216 = auVar217._0_32_;
        auVar205 = auVar208._0_28_;
        auVar97 = auVar244._0_32_;
        auVar226 = auVar227._0_32_;
        auVar160 = auVar161._0_32_;
        if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_620 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_620 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_620 >> 0x7f,0) == '\0') &&
              (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_620 >> 0xbf,0) == '\0') &&
            (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_620[0x1f]) goto LAB_010a4921;
        auVar122._8_4_ = 0x7f800000;
        auVar122._0_8_ = 0x7f8000007f800000;
        auVar122._12_4_ = 0x7f800000;
        auVar122._16_4_ = 0x7f800000;
        auVar122._20_4_ = 0x7f800000;
        auVar122._24_4_ = 0x7f800000;
        auVar122._28_4_ = 0x7f800000;
        auVar160 = vblendvps_avx(auVar122,auVar210._0_32_,local_620);
        auVar180 = vshufps_avx(auVar160,auVar160,0xb1);
        auVar180 = vminps_avx(auVar160,auVar180);
        auVar195 = vshufpd_avx(auVar180,auVar180,5);
        auVar180 = vminps_avx(auVar180,auVar195);
        auVar195 = vperm2f128_avx(auVar180,auVar180,1);
        auVar180 = vminps_avx(auVar180,auVar195);
        auVar180 = vcmpps_avx(auVar160,auVar180,0);
        auVar195 = local_620 & auVar180;
        auVar160 = local_620;
        if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar195 >> 0x7f,0) != '\0') ||
              (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar195 >> 0xbf,0) != '\0') ||
            (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar195[0x1f] < '\0') {
          auVar160 = vandps_avx(auVar180,local_620);
        }
        uVar90 = vmovmskps_avx(auVar160);
        uVar91 = 0;
        if (uVar90 != 0) {
          for (; (uVar90 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }